

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRDisplayNode::render
          (VRDisplayNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  pointer ppVVar1;
  iterator it;
  pointer ppVVar2;
  
  ppVVar2 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVVar1 = (this->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar1 == ppVVar2) {
    (**renderHandler->_vptr_VRRenderHandler)(renderHandler,renderState);
    return;
  }
  for (; ppVVar2 != ppVVar1; ppVVar2 = ppVVar2 + 1) {
    (*(*ppVVar2)->_vptr_VRDisplayNode[4])(*ppVVar2,renderState,renderHandler);
    ppVVar1 = (this->_children).
              super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  return;
}

Assistant:

void VRDisplayNode::render(VRDataIndex *renderState,
                           VRRenderHandler *renderHandler) {
  if (_children.size() > 0) {
		for (std::vector<VRDisplayNode*>::iterator it = _children.begin();
         it != _children.end(); it++) {
			(*it)->render(renderState, renderHandler);
		}
	} else {
		renderHandler->onVRRenderScene(*renderState);
	}
}